

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.hpp
# Opt level: O2

void __thiscall nivalis::Environment::Environment(Environment *this,Environment *other)

{
  std::vector<double,_std::allocator<double>_>::vector(&this->vars,&other->vars);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->varname,&other->varname);
  std::
  vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>::
  vector(&this->funcs,&other->funcs);
  std::__cxx11::string::string((string *)&this->error_msg,(string *)&other->error_msg);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->free_addrs,&other->free_addrs);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::_Rb_tree(&(this->vreg)._M_t,&(other->vreg)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::_Rb_tree(&(this->freg)._M_t,&(other->freg)._M_t);
  return;
}

Assistant:

Environment(const Environment& other) =default;